

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_do_gamma(png_row_infop row_info,png_bytep row,png_structrp png_ptr)

{
  png_uint_16 pVar1;
  uint uVar2;
  png_bytep ppVar3;
  png_uint_16pp pppVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  png_uint_16 v_3;
  int lsb;
  int msb;
  int d;
  int c;
  int b;
  int a;
  png_uint_16 v_2;
  png_uint_16 v_1;
  png_uint_16 v;
  png_uint_32 row_width;
  png_uint_32 i;
  png_bytep sp;
  int gamma_shift;
  png_const_uint_16pp gamma_16_table;
  png_const_bytep gamma_table;
  png_structrp png_ptr_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  ppVar3 = png_ptr->gamma_table;
  pppVar4 = png_ptr->gamma_16_table;
  uVar2 = row_info->width;
  if (((row_info->bit_depth < 9) && (ppVar3 != (png_bytep)0x0)) ||
     ((row_info->bit_depth == '\x10' && (pppVar4 != (png_uint_16pp)0x0)))) {
    bVar9 = (byte)png_ptr->gamma_shift;
    _row_width = row;
    switch(row_info->color_type) {
    case '\0':
      if (row_info->bit_depth == '\x02') {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 4) {
          uVar5 = *_row_width & 0xc0;
          uVar6 = *_row_width & 0x30;
          uVar7 = *_row_width & 0xc;
          uVar8 = *_row_width & 3;
          *_row_width = ppVar3[(int)(uVar5 | (int)uVar5 >> 2 | (int)uVar5 >> 4 | (int)uVar5 >> 6)] &
                        0xc0 | (byte)((int)(uint)ppVar3[(int)(uVar6 << 2 | uVar6 | (int)uVar6 >> 2 |
                                                             (int)uVar6 >> 4)] >> 2) & 0x30 |
                        (byte)((int)(uint)ppVar3[(int)(uVar7 << 4 | uVar7 << 2 | uVar7 |
                                                      (int)uVar7 >> 2)] >> 4) & 0xc |
                        (byte)((int)(uint)ppVar3[(int)(uVar8 << 6 | uVar8 << 4 | uVar8 << 2 | uVar8)
                                                ] >> 6);
          _row_width = _row_width + 1;
        }
      }
      if (row_info->bit_depth == '\x04') {
        _row_width = row;
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 2) {
          *_row_width = ppVar3[(int)(*_row_width & 0xf0 | (int)(*_row_width & 0xf0) >> 4)] & 0xf0 |
                        (byte)((int)(uint)ppVar3[(int)((*_row_width & 0xf) << 4 | *_row_width & 0xf)
                                                ] >> 4);
          _row_width = _row_width + 1;
        }
      }
      else if (row_info->bit_depth == '\b') {
        _row_width = row;
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          *_row_width = ppVar3[*_row_width];
          _row_width = _row_width + 1;
        }
      }
      else if (row_info->bit_depth == '\x10') {
        _row_width = row;
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          pVar1 = pppVar4[(int)(uint)_row_width[1] >> (bVar9 & 0x1f)][*_row_width];
          *_row_width = (byte)(pVar1 >> 8);
          _row_width[1] = (byte)pVar1;
          _row_width = _row_width + 2;
        }
      }
      break;
    default:
      break;
    case '\x02':
      if (row_info->bit_depth == '\b') {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          *_row_width = ppVar3[*_row_width];
          _row_width[1] = ppVar3[_row_width[1]];
          _row_width[2] = ppVar3[_row_width[2]];
          _row_width = _row_width + 3;
        }
      }
      else {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          pVar1 = pppVar4[(int)(uint)_row_width[1] >> (bVar9 & 0x1f)][*_row_width];
          *_row_width = (byte)(pVar1 >> 8);
          _row_width[1] = (byte)pVar1;
          pVar1 = pppVar4[(int)(uint)_row_width[3] >> (bVar9 & 0x1f)][_row_width[2]];
          _row_width[2] = (byte)(pVar1 >> 8);
          _row_width[3] = (byte)pVar1;
          pVar1 = pppVar4[(int)(uint)_row_width[5] >> (bVar9 & 0x1f)][_row_width[4]];
          _row_width[4] = (byte)(pVar1 >> 8);
          _row_width[5] = (byte)pVar1;
          _row_width = _row_width + 6;
        }
      }
      break;
    case '\x04':
      if (row_info->bit_depth == '\b') {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          *_row_width = ppVar3[*_row_width];
          _row_width = _row_width + 2;
        }
      }
      else {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          pVar1 = pppVar4[(int)(uint)_row_width[1] >> (bVar9 & 0x1f)][*_row_width];
          *_row_width = (byte)(pVar1 >> 8);
          _row_width[1] = (byte)pVar1;
          _row_width = _row_width + 4;
        }
      }
      break;
    case '\x06':
      if (row_info->bit_depth == '\b') {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          *_row_width = ppVar3[*_row_width];
          _row_width[1] = ppVar3[_row_width[1]];
          _row_width[2] = ppVar3[_row_width[2]];
          _row_width = _row_width + 4;
        }
      }
      else {
        for (_v_1 = 0; _v_1 < uVar2; _v_1 = _v_1 + 1) {
          pVar1 = pppVar4[(int)(uint)_row_width[1] >> (bVar9 & 0x1f)][*_row_width];
          *_row_width = (byte)(pVar1 >> 8);
          _row_width[1] = (byte)pVar1;
          pVar1 = pppVar4[(int)(uint)_row_width[3] >> (bVar9 & 0x1f)][_row_width[2]];
          _row_width[2] = (byte)(pVar1 >> 8);
          _row_width[3] = (byte)pVar1;
          pVar1 = pppVar4[(int)(uint)_row_width[5] >> (bVar9 & 0x1f)][_row_width[4]];
          _row_width[4] = (byte)(pVar1 >> 8);
          _row_width[5] = (byte)pVar1;
          _row_width = _row_width + 8;
        }
      }
    }
  }
  return;
}

Assistant:

static void
png_do_gamma(png_row_infop row_info, png_bytep row, png_structrp png_ptr)
{
   png_const_bytep gamma_table = png_ptr->gamma_table;
   png_const_uint_16pp gamma_16_table = png_ptr->gamma_16_table;
   int gamma_shift = png_ptr->gamma_shift;

   png_bytep sp;
   png_uint_32 i;
   png_uint_32 row_width=row_info->width;

   png_debug(1, "in png_do_gamma");

   if (((row_info->bit_depth <= 8 && gamma_table != NULL) ||
       (row_info->bit_depth == 16 && gamma_16_table != NULL)))
   {
      switch (row_info->color_type)
      {
         case PNG_COLOR_TYPE_RGB:
         {
            if (row_info->bit_depth == 8)
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  *sp = gamma_table[*sp];
                  sp++;
                  *sp = gamma_table[*sp];
                  sp++;
                  *sp = gamma_table[*sp];
                  sp++;
               }
            }

            else /* if (row_info->bit_depth == 16) */
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  png_uint_16 v;

                  v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;

                  v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;

                  v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;
               }
            }
            break;
         }

         case PNG_COLOR_TYPE_RGB_ALPHA:
         {
            if (row_info->bit_depth == 8)
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  *sp = gamma_table[*sp];
                  sp++;

                  *sp = gamma_table[*sp];
                  sp++;

                  *sp = gamma_table[*sp];
                  sp++;

                  sp++;
               }
            }

            else /* if (row_info->bit_depth == 16) */
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  png_uint_16 v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;

                  v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;

                  v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 4;
               }
            }
            break;
         }

         case PNG_COLOR_TYPE_GRAY_ALPHA:
         {
            if (row_info->bit_depth == 8)
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  *sp = gamma_table[*sp];
                  sp += 2;
               }
            }

            else /* if (row_info->bit_depth == 16) */
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  png_uint_16 v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 4;
               }
            }
            break;
         }

         case PNG_COLOR_TYPE_GRAY:
         {
            if (row_info->bit_depth == 2)
            {
               sp = row;
               for (i = 0; i < row_width; i += 4)
               {
                  int a = *sp & 0xc0;
                  int b = *sp & 0x30;
                  int c = *sp & 0x0c;
                  int d = *sp & 0x03;

                  *sp = (png_byte)(
                      ((((int)gamma_table[a|(a>>2)|(a>>4)|(a>>6)])   ) & 0xc0)|
                      ((((int)gamma_table[(b<<2)|b|(b>>2)|(b>>4)])>>2) & 0x30)|
                      ((((int)gamma_table[(c<<4)|(c<<2)|c|(c>>2)])>>4) & 0x0c)|
                      ((((int)gamma_table[(d<<6)|(d<<4)|(d<<2)|d])>>6) ));
                  sp++;
               }
            }

            if (row_info->bit_depth == 4)
            {
               sp = row;
               for (i = 0; i < row_width; i += 2)
               {
                  int msb = *sp & 0xf0;
                  int lsb = *sp & 0x0f;

                  *sp = (png_byte)((((int)gamma_table[msb | (msb >> 4)]) & 0xf0)
                      | (((int)gamma_table[(lsb << 4) | lsb]) >> 4));
                  sp++;
               }
            }

            else if (row_info->bit_depth == 8)
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  *sp = gamma_table[*sp];
                  sp++;
               }
            }

            else if (row_info->bit_depth == 16)
            {
               sp = row;
               for (i = 0; i < row_width; i++)
               {
                  png_uint_16 v = gamma_16_table[*(sp + 1) >> gamma_shift][*sp];
                  *sp = (png_byte)((v >> 8) & 0xff);
                  *(sp + 1) = (png_byte)(v & 0xff);
                  sp += 2;
               }
            }
            break;
         }

         default:
            break;
      }
   }
}